

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsLifetimeTests.cpp
# Opt level: O3

void __thiscall deqp::gls::LifetimeTests::details::LifeTest::testBindNoGen(LifeTest *this)

{
  CallLogWrapper *this_00;
  Type *pTVar1;
  char cVar2;
  deUint32 dVar3;
  int iVar4;
  GLenum GVar5;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  char *msg;
  ResultCollector errors;
  ResultCollector local_38;
  
  local_38.m_testCtx = (this->super_TestBase).super_TestCase.super_TestNode.m_testCtx;
  local_38.m_log = (local_38.m_testCtx)->m_log;
  local_38.m_result = QP_TEST_RESULT_PASS;
  local_38.m_message = "Pass";
  dVar3 = deRandom_getUint32(&(this->super_TestBase).m_rnd.m_rnd);
  iVar4 = (*this->m_type->_vptr_Type[4])(this->m_type,(ulong)dVar3);
  if ((char)iVar4 != '\0') {
    ResultCollector::addResult
              (&local_38,QP_TEST_RESULT_FAIL,"Randomly chosen identifier already exists");
    goto LAB_017f7bb5;
  }
  pTVar1 = this->m_type;
  iVar4 = (*pTVar1->_vptr_Type[6])(pTVar1);
  (**(code **)(*(long *)CONCAT44(extraout_var,iVar4) + 0x10))
            ((long *)CONCAT44(extraout_var,iVar4),dVar3);
  iVar4 = (*this->m_type->_vptr_Type[6])();
  cVar2 = (**(code **)(*(long *)CONCAT44(extraout_var_00,iVar4) + 0x20))
                    ((long *)CONCAT44(extraout_var_00,iVar4));
  this_00 = &(this->super_TestBase).super_CallLogWrapper;
  if (cVar2 == '\0') {
    GVar5 = glu::CallLogWrapper::glGetError(this_00);
    if (GVar5 != 0) {
      ResultCollector::addResult
                (&local_38,QP_TEST_RESULT_FAIL,
                 "Failed when binding a name not generated by Gen* call");
    }
    iVar4 = (*this->m_type->_vptr_Type[4])(this->m_type,(ulong)dVar3);
    if ((char)iVar4 == '\0') {
      msg = "Object was not created by the Bind* call";
      goto LAB_017f7b9d;
    }
  }
  else {
    GVar5 = glu::CallLogWrapper::glGetError(this_00);
    if (GVar5 != 0x502) {
      ResultCollector::addResult
                (&local_38,QP_TEST_RESULT_FAIL,
                 "Did not fail when binding a name not generated by Gen* call");
    }
    iVar4 = (*this->m_type->_vptr_Type[4])(this->m_type,(ulong)dVar3);
    if ((char)iVar4 != '\0') {
      msg = "Bind* created an object for a name not generated by a Gen* call";
LAB_017f7b9d:
      ResultCollector::addResult(&local_38,QP_TEST_RESULT_FAIL,msg);
    }
  }
  (*pTVar1->_vptr_Type[3])(pTVar1,(ulong)dVar3);
LAB_017f7bb5:
  ResultCollector::~ResultCollector(&local_38);
  return;
}

Assistant:

void LifeTest::testBindNoGen (void)
{
	ResultCollector	errors	(getTestContext());
	const GLuint	id		= m_rnd.getUint32();

	if (!errors.check(!m_type.exists(id), "Randomly chosen identifier already exists"))
		return;

	Name			name	(m_type, id);
	binder().bind(*name);

	if (binder().genRequired())
	{
		errors.check(glGetError() == GL_INVALID_OPERATION,
					 "Did not fail when binding a name not generated by Gen* call");
		errors.check(!m_type.exists(*name),
					 "Bind* created an object for a name not generated by a Gen* call");
	}
	else
	{
		errors.check(glGetError() == GL_NO_ERROR,
					 "Failed when binding a name not generated by Gen* call");
		errors.check(m_type.exists(*name),
					 "Object was not created by the Bind* call");
	}
}